

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repack_script_text_translation.cpp
# Opt level: O1

Mzp * patch_string_table(Mzp *__return_storage_ptr__,json *translation_db,Mzp *mzp_archive)

{
  pointer pcVar1;
  code *pcVar2;
  const_reference pvVar3;
  iterator iVar4;
  const_reference pvVar5;
  undefined1 auVar6 [8];
  ulong uVar7;
  uint uVar8;
  pointer pbVar9;
  undefined1 local_148 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> offsets;
  long local_120 [2];
  json *local_110;
  Mzp *local_108;
  string local_100;
  undefined1 local_e0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  original_strings;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  translated_strings;
  undefined1 local_a8 [8];
  string new_text_data;
  uint32_t text_write_offset;
  undefined1 auStack_78 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> new_text_offsets;
  undefined1 local_50 [8];
  string serialized_new_offsets;
  
  local_110 = translation_db;
  if ((long)(mzp_archive->entry_headers).
            super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(mzp_archive->entry_headers).
            super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
            ._M_impl.super__Vector_impl_data._M_start >> 3 !=
      (long)(mzp_archive->entry_data).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(mzp_archive->entry_data).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start >> 5) {
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  }
  if ((*(int *)&(mzp_archive->entry_headers).
                super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
                ._M_impl.super__Vector_impl_data._M_finish -
       *(int *)&(mzp_archive->entry_headers).
                super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
                ._M_impl.super__Vector_impl_data._M_start & 8U) == 0) {
    (__return_storage_ptr__->entry_data).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->entry_data).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->entry_headers).
    super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->entry_data).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->entry_headers).
    super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->entry_headers).
    super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    if ((mzp_archive->entry_headers).
        super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (mzp_archive->entry_headers).
        super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      translated_strings.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_108 = mzp_archive;
      do {
        parse_offset_table((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_148,
                           (mzp_archive->entry_data).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start +
                           (long)translated_strings.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
        uVar8 = (uint)translated_strings.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage | 1;
        extract_string_table
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_e0,
                   (mzp_archive->entry_data).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar8,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_148);
        fprintf(_stderr,"Loaded %lu strings from tables %u+%u\n",
                (long)original_strings.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start - (long)local_e0 >> 5,
                translated_strings.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)uVar8);
        pbVar9 = original_strings.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        original_strings.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        for (auVar6 = local_e0; mzp_archive = local_108, auVar6 != (undefined1  [8])pbVar9;
            auVar6 = (undefined1  [8])((long)auVar6 + 0x20)) {
          mg::util::sha256((string *)local_50,(string *)auVar6);
          mg::string::bytes_to_hex((string *)local_a8,(string *)local_50);
          if (local_50 != (undefined1  [8])&serialized_new_offsets._M_string_length) {
            operator_delete((void *)local_50,
                            CONCAT71(serialized_new_offsets._M_string_length._1_7_,
                                     (undefined1)serialized_new_offsets._M_string_length) + 1);
          }
          local_50 = (undefined1  [8])&serialized_new_offsets._M_string_length;
          pcVar1 = (((string *)auVar6)->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_50,pcVar1,pcVar1 + ((string *)auVar6)->_M_string_length);
          pvVar3 = nlohmann::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                               *)local_110,"script_text_by_hash");
          if ((((pvVar3->m_type == object) &&
               (iVar4 = std::
                        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                        ::find(&((pvVar3->m_value).object)->_M_t,(key_type *)local_a8),
               (_Rb_tree_header *)iVar4._M_node !=
               &(((pvVar3->m_value).object)->_M_t)._M_impl.super__Rb_tree_header)) &&
              (pvVar5 = nlohmann::
                        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        ::operator[](pvVar3,(key_type *)local_a8), pvVar5->m_type == object)) &&
             (iVar4 = std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                      ::find(&((pvVar5->m_value).object)->_M_t,&TARGET_LANGUAGE_abi_cxx11_),
             (_Rb_tree_header *)iVar4._M_node !=
             &(((pvVar5->m_value).object)->_M_t)._M_impl.super__Rb_tree_header)) {
            pvVar3 = nlohmann::
                     basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     ::operator[](pvVar3,(key_type *)local_a8);
            pvVar3 = nlohmann::
                     basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     ::operator[](pvVar3,&TARGET_LANGUAGE_abi_cxx11_);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::
            get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      (auStack_78,pvVar3);
            if (new_text_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              std::__cxx11::string::_M_assign((string *)local_50);
            }
            if (auStack_78 !=
                (undefined1  [8])
                &new_text_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_finish) {
              operator_delete((void *)auStack_78,
                              (long)new_text_offsets.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_finish + 1);
            }
          }
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string&>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &original_strings.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)local_50);
          if (local_50 != (undefined1  [8])&serialized_new_offsets._M_string_length) {
            operator_delete((void *)local_50,
                            CONCAT71(serialized_new_offsets._M_string_length._1_7_,
                                     (undefined1)serialized_new_offsets._M_string_length) + 1);
          }
          if (local_a8 != (undefined1  [8])&new_text_data._M_string_length) {
            operator_delete((void *)local_a8,
                            CONCAT71(new_text_data._M_string_length._1_7_,
                                     (undefined1)new_text_data._M_string_length) + 1);
          }
        }
        auStack_78 = (undefined1  [8])0x0;
        new_text_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        new_text_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_a8 = (undefined1  [8])&new_text_data._M_string_length;
        new_text_data._M_dataplus._M_p = (pointer)0x0;
        new_text_data._M_string_length._0_1_ = 0;
        new_text_data.field_2._12_4_ = 0;
        for (pbVar9 = original_strings.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage; pbVar9 != (pointer)0x0;
            pbVar9 = pbVar9 + 1) {
          local_50 = (undefined1  [8])&serialized_new_offsets._M_string_length;
          pcVar1 = (pbVar9->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_50,pcVar1,pcVar1 + pbVar9->_M_string_length);
          std::__cxx11::string::append((char *)local_50);
          std::__cxx11::string::resize
                    ((ulong)local_a8,
                     (char)serialized_new_offsets._M_dataplus._M_p +
                     (char)new_text_data._M_dataplus._M_p);
          memcpy((pointer)((long)local_a8 + (ulong)(uint)new_text_data.field_2._12_4_),
                 (void *)local_50,(size_t)serialized_new_offsets._M_dataplus._M_p);
          if (new_text_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start ==
              new_text_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
            std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int&>
                      ((vector<unsigned_int,std::allocator<unsigned_int>> *)auStack_78,
                       (iterator)
                       new_text_offsets.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start,
                       (uint *)(new_text_data.field_2._M_local_buf + 0xc));
          }
          else {
            *new_text_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start = new_text_data.field_2._12_4_;
            new_text_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
            .super__Vector_impl_data._M_start =
                 new_text_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start + 1;
          }
          new_text_data.field_2._12_4_ =
               new_text_data.field_2._12_4_ + (int)serialized_new_offsets._M_dataplus._M_p;
          if (local_50 != (undefined1  [8])&serialized_new_offsets._M_string_length) {
            operator_delete((void *)local_50,
                            CONCAT71(serialized_new_offsets._M_string_length._1_7_,
                                     (undefined1)serialized_new_offsets._M_string_length) + 1);
          }
        }
        if (new_text_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
            .super__Vector_impl_data._M_start ==
            new_text_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
            .super__Vector_impl_data._M_finish) {
          local_50 = (undefined1  [8])new_text_data._M_dataplus._M_p;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_long>
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_78,
                     (iterator)
                     new_text_offsets.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start,(unsigned_long *)local_50);
        }
        else {
          *new_text_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start = (uint)new_text_data._M_dataplus._M_p;
          new_text_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start =
               new_text_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start + 1;
        }
        local_50 = (undefined1  [8])new_text_data._M_dataplus._M_p;
        if (new_text_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
            .super__Vector_impl_data._M_start ==
            new_text_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
            .super__Vector_impl_data._M_finish) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_long>
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_78,
                     (iterator)
                     new_text_offsets.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start,(unsigned_long *)local_50);
        }
        else {
          *new_text_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start = (uint)new_text_data._M_dataplus._M_p;
          new_text_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start =
               new_text_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start + 1;
        }
        local_50._0_4_ = 0xffffffff;
        if (new_text_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
            .super__Vector_impl_data._M_start ==
            new_text_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
            .super__Vector_impl_data._M_finish) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_78,
                     (iterator)
                     new_text_offsets.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start,(uint *)local_50);
        }
        else {
          *new_text_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start = 0xffffffff;
          new_text_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start =
               new_text_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start + 1;
        }
        local_50._0_4_ = 0xffffffff;
        if (new_text_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
            .super__Vector_impl_data._M_start ==
            new_text_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
            .super__Vector_impl_data._M_finish) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_78,
                     (iterator)
                     new_text_offsets.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start,(uint *)local_50);
        }
        else {
          *new_text_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start = 0xffffffff;
          new_text_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start =
               new_text_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start + 1;
        }
        local_50._0_4_ = 0xffffffff;
        if (new_text_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
            .super__Vector_impl_data._M_start ==
            new_text_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
            .super__Vector_impl_data._M_finish) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_78,
                     (iterator)
                     new_text_offsets.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start,(uint *)local_50);
        }
        else {
          *new_text_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start = 0xffffffff;
          new_text_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start =
               new_text_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start + 1;
        }
        local_50 = (undefined1  [8])&serialized_new_offsets._M_string_length;
        serialized_new_offsets._M_dataplus._M_p = (pointer)0x0;
        serialized_new_offsets._M_string_length._0_1_ = 0;
        std::__cxx11::string::resize
                  ((ulong)local_50,
                   (char)new_text_offsets.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start - auStack_78[0]);
        if (auStack_78 !=
            (undefined1  [8])
            new_text_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
            .super__Vector_impl_data._M_start) {
          uVar7 = 0;
          auVar6 = auStack_78;
          do {
            uVar8 = *(uint *)auVar6;
            *(uint *)((long)local_50 + (uVar7 & 0xffffffff)) =
                 uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18;
            uVar7 = (uVar7 & 0xffffffff) + 4;
            auVar6 = (undefined1  [8])((long)auVar6 + 4);
          } while (auVar6 != (undefined1  [8])
                             new_text_offsets.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start);
        }
        local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_100,local_50,
                   serialized_new_offsets._M_dataplus._M_p + (long)local_50);
        mg::data::Mzp::add_entry(__return_storage_ptr__,&local_100);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._M_dataplus._M_p != &local_100.field_2) {
          operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
        }
        offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)local_120;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)
                   &offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,local_a8,
                   new_text_data._M_dataplus._M_p + (long)local_a8);
        mg::data::Mzp::add_entry
                  (__return_storage_ptr__,
                   (string *)
                   &offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        if (offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage != (pointer)local_120) {
          operator_delete(offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,local_120[0] + 1);
        }
        if (local_50 != (undefined1  [8])&serialized_new_offsets._M_string_length) {
          operator_delete((void *)local_50,
                          CONCAT71(serialized_new_offsets._M_string_length._1_7_,
                                   (undefined1)serialized_new_offsets._M_string_length) + 1);
        }
        if (local_a8 != (undefined1  [8])&new_text_data._M_string_length) {
          operator_delete((void *)local_a8,
                          CONCAT71(new_text_data._M_string_length._1_7_,
                                   (undefined1)new_text_data._M_string_length) + 1);
        }
        if (auStack_78 != (undefined1  [8])0x0) {
          operator_delete((void *)auStack_78,
                          (long)new_text_offsets.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_finish - (long)auStack_78);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&original_strings.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_e0);
        if (local_148 != (undefined1  [8])0x0) {
          operator_delete((void *)local_148,
                          (long)offsets.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_finish - (long)local_148);
        }
        translated_strings.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)(ulong)((uint)translated_strings.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 2);
      } while (translated_strings.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage <
               (pointer)((long)(mzp_archive->entry_headers).
                               super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(mzp_archive->entry_headers).
                               super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 3));
    }
    return __return_storage_ptr__;
  }
  pcVar2 = (code *)invalidInstructionException();
  (*pcVar2)();
}

Assistant:

mg::data::Mzp patch_string_table(const nlohmann::json &translation_db,
                                 const mg::data::Mzp mzp_archive) {
  // The MZP archive consists of N pairs of string offset table + string data
  // table. For each pair, iterate the string table, extract the string, hash
  // it, check if the translated string exists, and if so inject the translated
  // string instead.
  ASSERT(mzp_archive.entry_headers.size() == mzp_archive.entry_data.size());
  ASSERT(mzp_archive.entry_headers.size() % 2 == 0);

  // Return MZP
  mg::data::Mzp ret;

  for (unsigned i = 0; i < mzp_archive.entry_headers.size(); i += 2) {
    const unsigned offset_table_idx = i;
    const unsigned string_table_idx = i + 1;

    // Extract original strings
    const std::vector<uint32_t> offsets =
        parse_offset_table(mzp_archive.entry_data[offset_table_idx]);
    const std::vector<std::string> original_strings =
        extract_string_table(mzp_archive.entry_data[string_table_idx], offsets);
    fprintf(stderr, "Loaded %lu strings from tables %u+%u\n",
            original_strings.size(), offset_table_idx, string_table_idx);

    // Iterate the strings, and replace any translated ones with the appropriate
    // text
    std::vector<std::string> translated_strings;
    for (auto &line : original_strings) {
      // Hash the line
      const std::string line_digest_hex =
          mg::string::bytes_to_hex(mg::util::sha256(line));

      // If we find nothing, fall back to the original text
      std::string line_to_insert = line;

      // Is this hash in our TL DB?
      auto &script_text_by_hash = translation_db["script_text_by_hash"];
      if (script_text_by_hash.contains(line_digest_hex)) {
        if (script_text_by_hash[line_digest_hex].contains(TARGET_LANGUAGE)) {
          const std::string translated_line =
              script_text_by_hash[line_digest_hex][TARGET_LANGUAGE];
          if (translated_line.size() > 0) {
            // We have a translation
            line_to_insert = translated_line;
          }
        }
      }

      // Append the line to our output vector
      translated_strings.emplace_back(line_to_insert);
    }

    // Now that we have a vector of translated strings, we need to insert them
    // back into the MZP and update the offset table.
    // Note that during reinsertion, we re-add the \r\n escape sequence at the
    // end of each line
    std::vector<uint32_t> new_text_offsets;
    std::string new_text_data;
    uint32_t text_write_offset = 0;
    for (auto &line : translated_strings) {
      // Append \r\n
      const std::string padded_line = line + "\r\n";

      // Append this string to our buffer
      new_text_data.resize(new_text_data.size() + padded_line.size());
      memcpy(&new_text_data[text_write_offset], padded_line.data(),
             padded_line.size());

      // Add that offset for this string to the offset table
      new_text_offsets.emplace_back(text_write_offset);

      // Increment the write pointer by the size of the string
      text_write_offset += padded_line.size();
    }

    // For some reason, the offsets seem to include 2 instances of offsets that
    // point to the final byte of the string table. Recreate them here in case
    // the game actually needs this info.
    new_text_offsets.emplace_back(new_text_data.size());
    new_text_offsets.emplace_back(new_text_data.size());

    // The offset table ends with 12 bytes of 0xFF
    new_text_offsets.emplace_back(0xFFFFFFFF);
    new_text_offsets.emplace_back(0xFFFFFFFF);
    new_text_offsets.emplace_back(0xFFFFFFFF);

    // Now that we have the new string data, and the new list of offsets, pack
    // the list of offsets back into a byte array
    std::string serialized_new_offsets;
    serialized_new_offsets.resize(new_text_offsets.size() * sizeof(uint32_t));
    uint32_t offset_write_offset = 0;
    for (uint32_t offset : new_text_offsets) {
      const uint32_t be_offset = mg::host_to_be_u32(offset);
      memcpy(&serialized_new_offsets[offset_write_offset], &be_offset,
             sizeof(be_offset));
      offset_write_offset += sizeof(uint32_t);
    }

    // Add the new segments to our output MZP
    ret.add_entry(serialized_new_offsets);
    ret.add_entry(new_text_data);
  }

  return ret;
}